

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v5::format_to<char_const*,unsigned_int,std::__cxx11::string,500ul,char>
                   (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf,char **format_str,
                   uint *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char *s;
  size_t sVar1;
  iterator iVar2;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  ulong local_48 [2];
  pointer local_38;
  size_type sStack_30;
  
  s = *format_str;
  sVar1 = internal::length<char>(s);
  local_48[0] = (ulong)*args;
  local_38 = (args_1->_M_dataplus)._M_p;
  sStack_30 = args_1->_M_string_length;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = s;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_48;
  args_00.types_ = 0xb3;
  iVar2 = vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((range)buf,format_str_00,args_00);
  return (iterator)iVar2.container;
}

Assistant:

inline typename buffer_context<Char>::type::iterator format_to(
    basic_memory_buffer<Char, SIZE> &buf, const String &format_str,
    const Args & ... args) {
  internal::check_format_string<Args...>(format_str);
  return vformat_to(
        buf, basic_string_view<Char>(format_str),
        make_format_args<typename buffer_context<Char>::type>(args...));
}